

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

double av1_estimate_noise_from_single_plane_c
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  double dVar14;
  long local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  ulong local_50;
  int mat [3] [3];
  
  mat[0]._0_8_ = ZEXT48((uint)width);
  dVar14 = -1.0;
  if (2 < height) {
    local_50 = (ulong)(height - 1);
    lVar12 = 0;
    mat._8_8_ = 1;
    local_80 = 0;
    iVar6 = 0;
    do {
      mat[1]._4_8_ = lVar12;
      if (2 < (int)mat[0]._0_8_) {
        iVar11 = 1;
        do {
          lVar7 = -1;
          piVar9 = &local_78;
          lVar10 = lVar12;
          do {
            lVar7 = lVar7 + 1;
            lVar8 = 0;
            do {
              piVar9[lVar8] = (uint)src[(int)lVar10 + (int)lVar8];
              lVar8 = lVar8 + 1;
            } while (lVar8 != 3);
            lVar10 = lVar10 + (ulong)(uint)stride;
            piVar9 = piVar9 + 3;
          } while (lVar7 != 2);
          iVar5 = (((local_78 + local_60) - local_70) - local_58) + (local_6c - local_64) * 2;
          iVar2 = (((local_70 + local_78) - local_60) - local_58) + (local_74 - local_5c) * 2;
          iVar3 = -iVar5;
          if (0 < iVar5) {
            iVar3 = iVar5;
          }
          iVar5 = -iVar2;
          if (0 < iVar2) {
            iVar5 = iVar2;
          }
          if (iVar5 + iVar3 < edge_thresh) {
            uVar1 = local_70 + local_78 + local_60 + local_58 +
                    (local_74 + local_5c + local_64 + local_6c) * -2 + local_68 * 4;
            uVar4 = -uVar1;
            if (0 < (int)uVar1) {
              uVar4 = uVar1;
            }
            local_80 = local_80 + (ulong)uVar4;
            iVar6 = iVar6 + 1;
          }
          lVar12 = lVar12 + 1;
          bVar13 = iVar11 != width + -2;
          iVar11 = iVar11 + 1;
        } while (bVar13);
      }
      mat._8_8_ = mat._8_8_ + 1;
      lVar12 = mat[1]._4_8_ + (ulong)(uint)stride;
    } while (mat._8_8_ != local_50);
    if (0xf < iVar6) {
      dVar14 = ((double)local_80 / (double)(iVar6 * 6)) * 1.25331413732;
    }
  }
  return dVar14;
}

Assistant:

double av1_estimate_noise_from_single_plane_c(const uint8_t *src, int height,
                                              int width, int stride,
                                              int edge_thresh) {
  int64_t accum = 0;
  int count = 0;

  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), 0);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), 0);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}